

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs)

{
  uint *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pnVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  type t;
  cpp_dec_float<50U,_int,_void> local_d8;
  uint local_98 [2];
  uint auStack_90 [2];
  uint local_88 [2];
  uint auStack_80 [2];
  uint local_78 [4];
  cpp_dec_float<50U,_int,_void> local_68;
  
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  iVar9 = (rhs->super_IdxSet).len;
  *(int *)(this + 0xc) = iVar9;
  spx_realloc<int*>((int **)(this + 0x10),iVar9);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(this + 0x20),
          (int)((ulong)((long)(rhs->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(rhs->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,true);
  *(element_type **)(this + 0x40) =
       (rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x48),
             &(rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (rhs->setupStatus == true) {
    IdxSet::operator=((IdxSet *)this,&rhs->super_IdxSet);
    if (0 < (long)*(int *)(this + 8)) {
      lVar10 = (long)*(int *)(this + 8) + 1;
      do {
        lVar11 = (long)(*(int **)(this + 0x10))[lVar10 + -2];
        pnVar4 = (rhs->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = lVar11 * 0x38;
        lVar5 = *(long *)(this + 0x20);
        *(undefined8 *)(lVar5 + 0x20 + lVar12) =
             *(undefined8 *)((long)&pnVar4[lVar11].m_backend.data + 0x20);
        uVar6 = *(undefined8 *)&pnVar4[lVar11].m_backend.data;
        uVar7 = *(undefined8 *)((long)&pnVar4[lVar11].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar4[lVar11].m_backend.data + 0x10);
        uVar8 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (undefined8 *)(lVar5 + 0x10 + lVar12);
        *puVar2 = *(undefined8 *)puVar1;
        puVar2[1] = uVar8;
        *(undefined8 *)(lVar5 + lVar12) = uVar6;
        ((undefined8 *)(lVar5 + lVar12))[1] = uVar7;
        *(int *)(lVar5 + 0x28 + lVar12) = pnVar4[lVar11].m_backend.exp;
        *(bool *)(lVar5 + 0x2c + lVar12) = pnVar4[lVar11].m_backend.neg;
        *(undefined8 *)(lVar5 + 0x30 + lVar12) = *(undefined8 *)&pnVar4[lVar11].m_backend.fpclass;
        lVar10 = lVar10 + -1;
      } while (1 < lVar10);
    }
  }
  else {
    uVar13 = (int)((long)(rhs->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(rhs->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
    *(undefined4 *)(this + 8) = 0;
    if (0 < (int)uVar13) {
      lVar10 = 0;
      uVar14 = 0;
      do {
        pnVar4 = (rhs->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(int *)((long)&(pnVar4->m_backend).data + lVar10 + 0x30) == 2) {
LAB_002ab3b5:
          pnVar4 = (rhs->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_d8.data._M_elems._32_8_ =
               *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar10 + 0x20);
          puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar10);
          local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar10 + 0x10);
          local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_d8.exp = *(int *)((long)&(pnVar4->m_backend).data + lVar10 + 0x28);
          local_d8.neg = *(bool *)((long)&(pnVar4->m_backend).data + lVar10 + 0x2c);
          local_d8._48_8_ = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar10 + 0x30);
          if ((local_d8.neg == true) &&
             (local_d8.fpclass != cpp_dec_float_finite || local_d8.data._M_elems[0] != 0)) {
            local_d8.neg = false;
          }
          local_98 = (uint  [2])local_d8.data._M_elems._0_8_;
          auStack_90 = (uint  [2])local_d8.data._M_elems._8_8_;
          local_88 = (uint  [2])local_d8.data._M_elems._16_8_;
          auStack_80 = (uint  [2])local_d8.data._M_elems._24_8_;
          local_78._0_8_ = local_d8.data._M_elems._32_8_;
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_68,
                       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)this);
          if (((local_d8.fpclass == cpp_dec_float_NaN) || (local_68.fpclass == cpp_dec_float_NaN))
             || (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_d8,&local_68), iVar9 < 1)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       ((long)&(((rhs->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                       lVar10),0);
          }
          else {
            (rhs->super_IdxSet).idx[*(int *)(this + 8)] = (int)uVar14;
            *(int *)(*(long *)(this + 0x10) + (long)*(int *)(this + 8) * 4) = (int)uVar14;
            pnVar4 = (rhs->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar5 = *(long *)(this + 0x20);
            *(undefined8 *)(lVar5 + 0x20 + lVar10) =
                 *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar10 + 0x20);
            puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar10);
            uVar6 = *puVar2;
            uVar7 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar10 + 0x10);
            uVar8 = puVar2[1];
            puVar3 = (undefined8 *)(lVar5 + 0x10 + lVar10);
            *puVar3 = *puVar2;
            puVar3[1] = uVar8;
            *(undefined8 *)(lVar5 + lVar10) = uVar6;
            ((undefined8 *)(lVar5 + lVar10))[1] = uVar7;
            *(undefined4 *)(lVar5 + 0x28 + lVar10) =
                 *(undefined4 *)((long)&(pnVar4->m_backend).data + lVar10 + 0x28);
            *(undefined1 *)(lVar5 + 0x2c + lVar10) =
                 *(undefined1 *)((long)&(pnVar4->m_backend).data + lVar10 + 0x2c);
            *(undefined8 *)(lVar5 + 0x30 + lVar10) =
                 *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar10 + 0x30);
            *(int *)(this + 8) = *(int *)(this + 8) + 1;
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_d8,0,(type *)0x0);
          iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar4->m_backend).data + lVar10),&local_d8);
          if (iVar9 != 0) goto LAB_002ab3b5;
        }
        uVar14 = uVar14 + 1;
        lVar10 = lVar10 + 0x38;
      } while ((uVar13 & 0x7fffffff) != uVar14);
    }
    (rhs->super_IdxSet).num = *(int *)(this + 8);
    rhs->setupStatus = true;
  }
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x1;
  return;
}

Assistant:

void setup_and_assign(SSVectorBase<S>& rhs)
   {
      clear();
      setMax(rhs.max());
      VectorBase<R>::reDim(rhs.dim());
      _tolerances = rhs.tolerances();

      if(rhs.isSetup())
      {
         IdxSet::operator=(rhs);

         for(int i = size() - 1; i >= 0; --i)
         {
            int j  = index(i);
            VectorBase<R>::val[j] = rhs.val[j];
         }
      }
      else
      {
         int d = rhs.dim();
         num = 0;

         for(int i = 0; i < d; ++i)
         {
            if(rhs.val[i] != 0)
            {
               if(spxAbs(rhs.val[i]) > this->getEpsilon())
               {
                  rhs.idx[num] = i;
                  idx[num] = i;
                  VectorBase<R>::val[i] = rhs.val[i];
                  num++;
               }
               else
                  rhs.val[i] = 0;
            }
         }

         rhs.num = num;
         rhs.setupStatus = true;
      }

      setupStatus = true;

      assert(rhs.isConsistent());
      assert(isConsistent());
   }